

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<long>::RepeatedField
          (RepeatedField<long> *this,RepeatedField<long> *other)

{
  Arena *pAVar1;
  RepeatedField<long> *other_local;
  RepeatedField<long> *this_local;
  
  RepeatedField(this);
  pAVar1 = GetArena(other);
  if (pAVar1 == (Arena *)0x0) {
    InternalSwap(this,other);
  }
  else {
    CopyFrom(this,other);
  }
  return;
}

Assistant:

inline RepeatedField<Element>::RepeatedField(RepeatedField&& other) noexcept
    : RepeatedField() {
#ifdef PROTOBUF_FORCE_COPY_IN_MOVE
  CopyFrom(other);
#else   // PROTOBUF_FORCE_COPY_IN_MOVE
  // We don't just call Swap(&other) here because it would perform 3 copies if
  // other is on an arena. This field can't be on an arena because arena
  // construction always uses the Arena* accepting constructor.
  if (other.GetArena()) {
    CopyFrom(other);
  } else {
    InternalSwap(&other);
  }
#endif  // !PROTOBUF_FORCE_COPY_IN_MOVE
}